

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O2

void print_NEWstring(LispPTR x)

{
  LispPTR *pLVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  pLVar1 = NativeAligned4FromLAddr(x);
  uVar2 = (uint)(ushort)pLVar1[2];
  uVar3 = (long)Lisp_world + (ulong)(ushort)pLVar1[1] + (ulong)(*pLVar1 & 0xfffffff) * 2;
  putchar(0x22);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    putchar((uint)*(byte *)(uVar3 ^ 3));
    uVar3 = uVar3 + 1;
  }
  putchar(0x22);
  return;
}

Assistant:

void print_NEWstring(LispPTR x) {
  NEWSTRINGP *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
  st_length = string_point->fillpointer;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);
  string_base += string_point->offset;

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 0; i < st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}